

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psroipooling.cpp
# Opt level: O2

int __thiscall
ncnn::PSROIPooling::forward
          (PSROIPooling *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  pointer pMVar5;
  Mat *this_00;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined4 extraout_EAX;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  float *pfVar18;
  ulong uVar19;
  ulong uVar20;
  float *pfVar21;
  int x;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float local_11c;
  float local_118;
  float fStack_114;
  void *local_100;
  float fStack_d4;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pMVar5->c == this->pooled_width * this->output_dim * this->pooled_height) {
    iVar3 = pMVar5->w;
    uVar19 = (ulong)iVar3;
    iVar4 = pMVar5->h;
    this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_00,this->pooled_width,this->pooled_height,this->output_dim,pMVar5->elemsize,
                opt->blob_allocator);
    pvVar6 = this_00->data;
    iVar29 = -100;
    if ((pvVar6 != (void *)0x0) && (sVar7 = this_00->cstep, (long)this_00->c * sVar7 != 0)) {
      uVar1 = *pMVar5[1].data;
      uVar2 = *(undefined8 *)((long)pMVar5[1].data + 8);
      fVar31 = roundf((float)uVar1);
      fStack_d4 = (float)((ulong)uVar1 >> 0x20);
      fVar32 = roundf(fStack_d4);
      fVar35 = this->spatial_scale;
      fVar31 = fVar31 * fVar35;
      fVar32 = fVar32 * fVar35;
      local_118 = (float)uVar2;
      fStack_114 = (float)((ulong)uVar2 >> 0x20);
      fVar33 = roundf(local_118 + 1.0);
      fVar34 = roundf(fStack_114 + 1.0);
      fVar33 = fVar33 * fVar35 - fVar31;
      fVar35 = fVar34 * fVar35 - fVar32;
      iVar29 = -(uint)(fVar33 < 0.1);
      iVar30 = -(uint)(fVar35 < 0.1);
      auVar9._4_4_ = iVar29;
      auVar9._0_4_ = iVar29;
      auVar9._8_4_ = iVar30;
      auVar9._12_4_ = iVar30;
      uVar10 = movmskpd(extraout_EAX,auVar9);
      local_11c = 0.1;
      local_118 = 0.1;
      if ((uVar10 & 1) == 0) {
        local_118 = fVar33;
      }
      if ((uVar10 & 2) == 0) {
        local_11c = fVar35;
      }
      local_118 = local_118 / (float)this->pooled_width;
      iVar30 = this->pooled_height;
      fVar35 = (float)iVar30;
      if (iVar30 < 1) {
        iVar30 = 0;
      }
      uVar13 = (ulong)(uint)this->output_dim;
      if (this->output_dim < 1) {
        uVar13 = 0;
      }
      for (uVar28 = 0; iVar29 = 0, uVar28 != uVar13; uVar28 = uVar28 + 1) {
        local_100 = (void *)(sVar7 * uVar28 * this_00->elemsize + (long)pvVar6);
        uVar10 = this->pooled_width;
        iVar29 = 0;
        uVar16 = 0;
        if (0 < (int)uVar10) {
          uVar16 = (ulong)uVar10;
        }
        while (iVar29 != iVar30) {
          fVar33 = floorf((float)iVar29 * (local_11c / fVar35) + fVar32);
          fVar34 = ceilf((float)(iVar29 + 1) * (local_11c / fVar35) + fVar32);
          iVar15 = (int)fVar34;
          uVar24 = (ulong)(uint)(int)fVar33;
          if ((int)fVar33 < 1) {
            uVar24 = 0;
          }
          iVar23 = (int)uVar24;
          iVar11 = iVar23;
          if (iVar4 < iVar23) {
            iVar11 = iVar4;
          }
          if (iVar15 < 1) {
            iVar15 = 0;
          }
          if (iVar4 < iVar15) {
            iVar15 = iVar4;
          }
          uVar14 = (long)iVar4;
          if ((long)uVar24 < (long)iVar4) {
            uVar14 = uVar24;
          }
          lVar27 = (long)(int)((this->pooled_height * (int)uVar28 + iVar29) * uVar10);
          uVar24 = 0;
          while (uVar24 != uVar16) {
            sVar8 = pMVar5->elemsize;
            fVar33 = floorf((float)(int)uVar24 * local_118 + fVar31);
            fVar34 = ceilf((float)(int)(uVar24 + 1) * local_118 + fVar31);
            iVar12 = (int)fVar34;
            uVar26 = (ulong)(uint)(int)fVar33;
            if ((int)fVar33 < 1) {
              uVar26 = 0;
            }
            iVar25 = (int)uVar26;
            iVar17 = iVar25;
            if (iVar3 < iVar25) {
              iVar17 = iVar3;
            }
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            if (iVar3 < iVar12) {
              iVar12 = iVar3;
            }
            if ((long)uVar19 <= (long)uVar26) {
              uVar26 = uVar19;
            }
            pfVar18 = (float *)((long)pMVar5->data +
                               sVar8 * pMVar5->cstep * lVar27 + uVar26 * 4 + uVar19 * 4 * uVar14);
            fVar33 = 0.0;
            for (uVar20 = uVar14; pfVar21 = pfVar18, uVar22 = uVar26, (long)uVar20 < (long)iVar15;
                uVar20 = uVar20 + 1) {
              for (; (long)uVar22 < (long)iVar12; uVar22 = uVar22 + 1) {
                fVar33 = fVar33 + *pfVar21;
                pfVar21 = pfVar21 + 1;
              }
              pfVar18 = pfVar18 + uVar19;
            }
            fVar34 = 0.0;
            if (iVar25 < iVar12 && iVar23 < iVar15) {
              fVar34 = fVar33 / (float)((iVar12 - iVar17) * (iVar15 - iVar11));
            }
            *(float *)((long)local_100 + uVar24 * 4) = fVar34;
            lVar27 = lVar27 + 1;
            uVar24 = uVar24 + 1;
          }
          local_100 = (void *)((long)local_100 + (long)(int)uVar10 * 4);
          iVar29 = iVar29 + 1;
        }
      }
    }
  }
  else {
    iVar29 = -1;
  }
  return iVar29;
}

Assistant:

int PSROIPooling::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    if (channels != output_dim * pooled_width * pooled_height)
    {
        // input channel number does not match layer parameters
        return -1;
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, output_dim, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: avg pool over R
    const float* roi_ptr = roi_blob;

    float roi_x1 = static_cast<float>(round(roi_ptr[0]) * spatial_scale);
    float roi_y1 = static_cast<float>(round(roi_ptr[1]) * spatial_scale);
    float roi_x2 = static_cast<float>(round(roi_ptr[2] + 1.f) * spatial_scale);
    float roi_y2 = static_cast<float>(round(roi_ptr[3] + 1.f) * spatial_scale);

    float roi_w = std::max(roi_x2 - roi_x1, 0.1f);
    float roi_h = std::max(roi_y2 - roi_y1, 0.1f);

    float bin_size_w = roi_w / (float)pooled_width;
    float bin_size_h = roi_h / (float)pooled_height;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < output_dim; q++)
    {
        float* outptr = top_blob.channel(q);

        for (int ph = 0; ph < pooled_height; ph++)
        {
            for (int pw = 0; pw < pooled_width; pw++)
            {
                const float* ptr = bottom_blob.channel((q * pooled_height + ph) * pooled_width + pw);

                int hstart = static_cast<int>(floor(roi_y1 + (float)(ph)*bin_size_h));
                int wstart = static_cast<int>(floor(roi_x1 + (float)(pw)*bin_size_w));
                int hend = static_cast<int>(ceil(roi_y1 + (float)(ph + 1) * bin_size_h));
                int wend = static_cast<int>(ceil(roi_x1 + (float)(pw + 1) * bin_size_w));

                hstart = std::min(std::max(hstart, 0), h);
                wstart = std::min(std::max(wstart, 0), w);
                hend = std::min(std::max(hend, 0), h);
                wend = std::min(std::max(wend, 0), w);

                bool is_empty = (hend <= hstart) || (wend <= wstart);
                int area = (hend - hstart) * (wend - wstart);

                float sum = 0.f;
                for (int y = hstart; y < hend; y++)
                {
                    for (int x = wstart; x < wend; x++)
                    {
                        int index = y * w + x;
                        sum += ptr[index];
                    }
                }

                outptr[pw] = is_empty ? 0.f : (sum / (float)area);
            }

            outptr += pooled_width;
        }
    }

    return 0;
}